

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlSchemaTypePtr xmlSchemaInitBasicType(char *name,xmlSchemaValType type,xmlSchemaTypePtr baseType)

{
  xmlSchemaFacetPtr pxVar1;
  xmlSchemaTypePtr ret;
  xmlSchemaTypePtr baseType_local;
  xmlSchemaValType type_local;
  char *name_local;
  
  name_local = (char *)(*xmlMalloc)(0xe0);
  if (name_local == (char *)0x0) {
    xmlSchemaTypeErrMemory((xmlNodePtr)0x0,"could not initialize basic types");
    name_local = (char *)0x0;
  }
  else {
    name_local[0xd0] = '\0';
    name_local[0xd1] = '\0';
    name_local[0xd2] = '\0';
    name_local[0xd3] = '\0';
    name_local[0xd4] = '\0';
    name_local[0xd5] = '\0';
    name_local[0xd6] = '\0';
    name_local[0xd7] = '\0';
    name_local[0xd8] = '\0';
    name_local[0xd9] = '\0';
    name_local[0xda] = '\0';
    name_local[0xdb] = '\0';
    name_local[0xdc] = '\0';
    name_local[0xdd] = '\0';
    name_local[0xde] = '\0';
    name_local[0xdf] = '\0';
    name_local[0xc0] = '\0';
    name_local[0xc1] = '\0';
    name_local[0xc2] = '\0';
    name_local[0xc3] = '\0';
    name_local[0xc4] = '\0';
    name_local[0xc5] = '\0';
    name_local[0xc6] = '\0';
    name_local[199] = '\0';
    name_local[200] = '\0';
    name_local[0xc9] = '\0';
    name_local[0xca] = '\0';
    name_local[0xcb] = '\0';
    name_local[0xcc] = '\0';
    name_local[0xcd] = '\0';
    name_local[0xce] = '\0';
    name_local[0xcf] = '\0';
    name_local[0xb0] = '\0';
    name_local[0xb1] = '\0';
    name_local[0xb2] = '\0';
    name_local[0xb3] = '\0';
    name_local[0xb4] = '\0';
    name_local[0xb5] = '\0';
    name_local[0xb6] = '\0';
    name_local[0xb7] = '\0';
    name_local[0xb8] = '\0';
    name_local[0xb9] = '\0';
    name_local[0xba] = '\0';
    name_local[0xbb] = '\0';
    name_local[0xbc] = '\0';
    name_local[0xbd] = '\0';
    name_local[0xbe] = '\0';
    name_local[0xbf] = '\0';
    name_local[0xa0] = '\0';
    name_local[0xa1] = '\0';
    name_local[0xa2] = '\0';
    name_local[0xa3] = '\0';
    name_local[0xa4] = '\0';
    name_local[0xa5] = '\0';
    name_local[0xa6] = '\0';
    name_local[0xa7] = '\0';
    name_local[0xa8] = '\0';
    name_local[0xa9] = '\0';
    name_local[0xaa] = '\0';
    name_local[0xab] = '\0';
    name_local[0xac] = '\0';
    name_local[0xad] = '\0';
    name_local[0xae] = '\0';
    name_local[0xaf] = '\0';
    name_local[0x90] = '\0';
    name_local[0x91] = '\0';
    name_local[0x92] = '\0';
    name_local[0x93] = '\0';
    name_local[0x94] = '\0';
    name_local[0x95] = '\0';
    name_local[0x96] = '\0';
    name_local[0x97] = '\0';
    name_local[0x98] = '\0';
    name_local[0x99] = '\0';
    name_local[0x9a] = '\0';
    name_local[0x9b] = '\0';
    name_local[0x9c] = '\0';
    name_local[0x9d] = '\0';
    name_local[0x9e] = '\0';
    name_local[0x9f] = '\0';
    name_local[0x80] = '\0';
    name_local[0x81] = '\0';
    name_local[0x82] = '\0';
    name_local[0x83] = '\0';
    name_local[0x84] = '\0';
    name_local[0x85] = '\0';
    name_local[0x86] = '\0';
    name_local[0x87] = '\0';
    name_local[0x88] = '\0';
    name_local[0x89] = '\0';
    name_local[0x8a] = '\0';
    name_local[0x8b] = '\0';
    name_local[0x8c] = '\0';
    name_local[0x8d] = '\0';
    name_local[0x8e] = '\0';
    name_local[0x8f] = '\0';
    name_local[0x70] = '\0';
    name_local[0x71] = '\0';
    name_local[0x72] = '\0';
    name_local[0x73] = '\0';
    name_local[0x74] = '\0';
    name_local[0x75] = '\0';
    name_local[0x76] = '\0';
    name_local[0x77] = '\0';
    name_local[0x78] = '\0';
    name_local[0x79] = '\0';
    name_local[0x7a] = '\0';
    name_local[0x7b] = '\0';
    name_local[0x7c] = '\0';
    name_local[0x7d] = '\0';
    name_local[0x7e] = '\0';
    name_local[0x7f] = '\0';
    name_local[0x60] = '\0';
    name_local[0x61] = '\0';
    name_local[0x62] = '\0';
    name_local[99] = '\0';
    name_local[100] = '\0';
    name_local[0x65] = '\0';
    name_local[0x66] = '\0';
    name_local[0x67] = '\0';
    name_local[0x68] = '\0';
    name_local[0x69] = '\0';
    name_local[0x6a] = '\0';
    name_local[0x6b] = '\0';
    name_local[0x6c] = '\0';
    name_local[0x6d] = '\0';
    name_local[0x6e] = '\0';
    name_local[0x6f] = '\0';
    name_local[0x50] = '\0';
    name_local[0x51] = '\0';
    name_local[0x52] = '\0';
    name_local[0x53] = '\0';
    name_local[0x54] = '\0';
    name_local[0x55] = '\0';
    name_local[0x56] = '\0';
    name_local[0x57] = '\0';
    name_local[0x58] = '\0';
    name_local[0x59] = '\0';
    name_local[0x5a] = '\0';
    name_local[0x5b] = '\0';
    name_local[0x5c] = '\0';
    name_local[0x5d] = '\0';
    name_local[0x5e] = '\0';
    name_local[0x5f] = '\0';
    name_local[0x40] = '\0';
    name_local[0x41] = '\0';
    name_local[0x42] = '\0';
    name_local[0x43] = '\0';
    name_local[0x44] = '\0';
    name_local[0x45] = '\0';
    name_local[0x46] = '\0';
    name_local[0x47] = '\0';
    name_local[0x48] = '\0';
    name_local[0x49] = '\0';
    name_local[0x4a] = '\0';
    name_local[0x4b] = '\0';
    name_local[0x4c] = '\0';
    name_local[0x4d] = '\0';
    name_local[0x4e] = '\0';
    name_local[0x4f] = '\0';
    name_local[0x30] = '\0';
    name_local[0x31] = '\0';
    name_local[0x32] = '\0';
    name_local[0x33] = '\0';
    name_local[0x34] = '\0';
    name_local[0x35] = '\0';
    name_local[0x36] = '\0';
    name_local[0x37] = '\0';
    name_local[0x38] = '\0';
    name_local[0x39] = '\0';
    name_local[0x3a] = '\0';
    name_local[0x3b] = '\0';
    name_local[0x3c] = '\0';
    name_local[0x3d] = '\0';
    name_local[0x3e] = '\0';
    name_local[0x3f] = '\0';
    name_local[0x20] = '\0';
    name_local[0x21] = '\0';
    name_local[0x22] = '\0';
    name_local[0x23] = '\0';
    name_local[0x24] = '\0';
    name_local[0x25] = '\0';
    name_local[0x26] = '\0';
    name_local[0x27] = '\0';
    name_local[0x28] = '\0';
    name_local[0x29] = '\0';
    name_local[0x2a] = '\0';
    name_local[0x2b] = '\0';
    name_local[0x2c] = '\0';
    name_local[0x2d] = '\0';
    name_local[0x2e] = '\0';
    name_local[0x2f] = '\0';
    name_local[0x10] = '\0';
    name_local[0x11] = '\0';
    name_local[0x12] = '\0';
    name_local[0x13] = '\0';
    name_local[0x14] = '\0';
    name_local[0x15] = '\0';
    name_local[0x16] = '\0';
    name_local[0x17] = '\0';
    name_local[0x18] = '\0';
    name_local[0x19] = '\0';
    name_local[0x1a] = '\0';
    name_local[0x1b] = '\0';
    name_local[0x1c] = '\0';
    name_local[0x1d] = '\0';
    name_local[0x1e] = '\0';
    name_local[0x1f] = '\0';
    name_local[0] = '\0';
    name_local[1] = '\0';
    name_local[2] = '\0';
    name_local[3] = '\0';
    name_local[4] = '\0';
    name_local[5] = '\0';
    name_local[6] = '\0';
    name_local[7] = '\0';
    name_local[8] = '\0';
    name_local[9] = '\0';
    name_local[10] = '\0';
    name_local[0xb] = '\0';
    name_local[0xc] = '\0';
    name_local[0xd] = '\0';
    name_local[0xe] = '\0';
    name_local[0xf] = '\0';
    *(char **)(name_local + 0x10) = name;
    *(char **)(name_local + 0xd0) = "http://www.w3.org/2001/XMLSchema";
    name_local[0] = '\x01';
    name_local[1] = '\0';
    name_local[2] = '\0';
    name_local[3] = '\0';
    *(xmlSchemaTypePtr *)(name_local + 0x70) = baseType;
    name_local[0x5c] = '\x06';
    name_local[0x5d] = '\0';
    name_local[0x5e] = '\0';
    name_local[0x5f] = '\0';
    if ((((type == XML_SCHEMAS_STRING) || (type - XML_SCHEMAS_DECIMAL < 0xd)) ||
        (type == XML_SCHEMAS_QNAME)) ||
       ((type - XML_SCHEMAS_NOTATION < 2 ||
        (type == XML_SCHEMAS_HEXBINARY || type == XML_SCHEMAS_BASE64BINARY)))) {
      *(uint *)(name_local + 0x58) = *(uint *)(name_local + 0x58) | 0x4000;
    }
    if (((type == XML_SCHEMAS_NMTOKENS) || (type == XML_SCHEMAS_IDREFS)) ||
       (type == XML_SCHEMAS_ENTITIES)) {
      *(uint *)(name_local + 0x58) = *(uint *)(name_local + 0x58) | 0x40;
      pxVar1 = xmlSchemaNewMinLengthFacet(1);
      *(xmlSchemaFacetPtr *)(name_local + 0x78) = pxVar1;
      *(uint *)(name_local + 0x58) = *(uint *)(name_local + 0x58) | 0x8000000;
    }
    else if (type != XML_SCHEMAS_ANYTYPE && type != XML_SCHEMAS_ANYSIMPLETYPE) {
      *(uint *)(name_local + 0x58) = *(uint *)(name_local + 0x58) | 0x100;
    }
    xmlHashAddEntry2(xmlSchemaTypesBank,*(xmlChar **)(name_local + 0x10),
                     (xmlChar *)"http://www.w3.org/2001/XMLSchema",name_local);
    *(xmlSchemaValType *)(name_local + 0xa0) = type;
  }
  return (xmlSchemaTypePtr)name_local;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaInitBasicType(const char *name, xmlSchemaValType type,
		       xmlSchemaTypePtr baseType) {
    xmlSchemaTypePtr ret;

    ret = (xmlSchemaTypePtr) xmlMalloc(sizeof(xmlSchemaType));
    if (ret == NULL) {
        xmlSchemaTypeErrMemory(NULL, "could not initialize basic types");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaType));
    ret->name = (const xmlChar *)name;
    ret->targetNamespace = XML_SCHEMAS_NAMESPACE_NAME;
    ret->type = XML_SCHEMA_TYPE_BASIC;
    ret->baseType = baseType;
    ret->contentType = XML_SCHEMA_CONTENT_BASIC;
    /*
    * Primitive types.
    */
    switch (type) {
	case XML_SCHEMAS_STRING:
	case XML_SCHEMAS_DECIMAL:
	case XML_SCHEMAS_DATE:
	case XML_SCHEMAS_DATETIME:
	case XML_SCHEMAS_TIME:
	case XML_SCHEMAS_GYEAR:
	case XML_SCHEMAS_GYEARMONTH:
	case XML_SCHEMAS_GMONTH:
	case XML_SCHEMAS_GMONTHDAY:
	case XML_SCHEMAS_GDAY:
	case XML_SCHEMAS_DURATION:
	case XML_SCHEMAS_FLOAT:
	case XML_SCHEMAS_DOUBLE:
	case XML_SCHEMAS_BOOLEAN:
	case XML_SCHEMAS_ANYURI:
	case XML_SCHEMAS_HEXBINARY:
	case XML_SCHEMAS_BASE64BINARY:
	case XML_SCHEMAS_QNAME:
	case XML_SCHEMAS_NOTATION:
	    ret->flags |= XML_SCHEMAS_TYPE_BUILTIN_PRIMITIVE;
	    break;
	default:
	    break;
    }
    /*
    * Set variety.
    */
    switch (type) {
	case XML_SCHEMAS_ANYTYPE:
	case XML_SCHEMAS_ANYSIMPLETYPE:
	    break;
	case XML_SCHEMAS_IDREFS:
	case XML_SCHEMAS_NMTOKENS:
	case XML_SCHEMAS_ENTITIES:
	    ret->flags |= XML_SCHEMAS_TYPE_VARIETY_LIST;
	    ret->facets = xmlSchemaNewMinLengthFacet(1);
	    ret->flags |= XML_SCHEMAS_TYPE_HAS_FACETS;
	    break;
	default:
	    ret->flags |= XML_SCHEMAS_TYPE_VARIETY_ATOMIC;
	    break;
    }
    xmlHashAddEntry2(xmlSchemaTypesBank, ret->name,
	             XML_SCHEMAS_NAMESPACE_NAME, ret);
    ret->builtInType = type;
    return(ret);
}